

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::Distance> *
metaf::Distance::fromMileString
          (optional<metaf::Distance> *__return_storage_ptr__,string *s,bool remarkFormat)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> _Var5;
  size_type sVar6;
  optional<unsigned_int> oVar7;
  ulong uVar8;
  size_t digits;
  int iVar9;
  byte bVar10;
  Modifier MVar11;
  optional<std::pair<unsigned_int,_unsigned_int>_> oVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  if ((fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&fromMileString(std::__cxx11::string_const&,bool)::
                                   unitStr_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_,"SM",
               (allocator<char> *)&bStack_48);
    __cxa_atexit(std::__cxx11::string::~string,
                 &fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_);
  }
  if ((fromMileString(std::__cxx11::string_const&,bool)::unitLength == '\0') &&
     (iVar9 = __cxa_guard_acquire(&fromMileString(std::__cxx11::string_const&,bool)::unitLength),
     iVar9 != 0)) {
    fromMileString::unitLength =
         fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_._M_string_length;
    __cxa_guard_release(&fromMileString(std::__cxx11::string_const&,bool)::unitLength);
  }
  if (remarkFormat) {
    if (s->_M_string_length == 0) goto LAB_0018a253;
  }
  else {
    if (s->_M_string_length < fromMileString::unitLength + 1) goto LAB_0018a253;
    bVar2 = std::operator==(s,"////SM");
    if (bVar2) {
      (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier = NONE;
      (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
      super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> = (_Optional_payload_base<unsigned_int>)0x0;
      goto LAB_0018a273;
    }
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)s);
    bVar2 = std::operator!=(&bStack_48,
                            &fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_48);
    if (bVar2) goto LAB_0018a253;
  }
  cVar1 = *(s->_M_dataplus)._M_p;
  if (cVar1 == 'M') {
    MVar11 = LESS_THAN;
LAB_0018a150:
    bVar10 = 1;
  }
  else {
    bVar10 = 0;
    MVar11 = NONE;
    if (cVar1 == 'P') {
      MVar11 = MORE_THAN;
      goto LAB_0018a150;
    }
  }
  lVar4 = std::__cxx11::string::find((char)s,0x2f);
  uVar8 = (ulong)bVar10;
  if (lVar4 == -1) {
    sVar6 = fromMileString::unitLength;
    if (remarkFormat) {
      sVar6 = 0;
    }
    digits = s->_M_string_length - (sVar6 + uVar8);
    if ((digits == 0 || 2 < digits) ||
       (oVar7 = strToUint(s,uVar8,digits),
       ((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0)) goto LAB_0018a253;
    uVar3 = oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload * 10000;
  }
  else {
    sVar6 = fromMileString::unitLength;
    if (remarkFormat) {
      sVar6 = 0;
    }
    oVar12 = fractionStrToUint(s,uVar8,(s->_M_string_length - uVar8) - sVar6);
    _Var5 = oVar12.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>.
            _M_payload.super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>.
            _M_payload;
    if (((undefined1  [12])
         oVar12.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
         super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_> &
        (undefined1  [12])0x1) == (undefined1  [12])0x0) {
LAB_0018a253:
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_payload = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
               super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) = 0;
      *(undefined4 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_engaged = 0;
      return __return_storage_ptr__;
    }
    uVar8 = (ulong)_Var5 >> 0x20;
    uVar3 = oVar12.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>.
            _M_payload.super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>.
            _M_payload._0_4_;
    if (uVar8 == 0 || uVar3 == 0) goto LAB_0018a253;
    iVar9 = 0;
    if (oVar12.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
        super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload._4_4_ <=
        uVar3) {
      _Var5 = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)((ulong)uVar3 % 10);
      if (_Var5._M_value.first == 0) goto LAB_0018a253;
      iVar9 = (uVar3 / 10) * 10000;
    }
    uVar3 = (int)((_Var5._M_value.first * 10000) / uVar8) + iVar9;
  }
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier = MVar11;
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
  super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)((ulong)uVar3 | 0x100000000);
LAB_0018a273:
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distUnit = STATUTE_MILES;
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::optional<Distance> Distance::fromMileString(const std::string & s, 
	bool remarkFormat)
{
	// static const std::regex rgx ("([PM])?(\\d?\\d)(?:/(\\d?\\d))?SM|////SM");
	// static const std::regex rgx ("([PM])?(\\d?\\d)(?:/(\\d?\\d))?");
	static const std::optional<Distance> error;
	static const auto unitStr = std::string ("SM");
	static const auto unitLength = unitStr.length();

	Distance distance;
	distance.distUnit = Unit::STATUTE_MILES;
	if (!remarkFormat) {
		if (s.length() < unitLength + 1) return error; //1 digit minimum
		if (s == "////SM") return distance;
		if (s.substr(s.length() - unitLength, unitLength) != unitStr) return error; //s.endsWith(unitStr)
	} else {
		if (s.length() < 1) return error; //1 digit minimum
	}
	const auto modifier = modifierFromChar(s[0]);
	if (modifier.has_value()) {
		distance.distModifier = *modifier;
	}

	if (s.find('/') == std::string::npos) {
		//The value is integer, e.g. 3SM or 15SM
		const std::size_t intPos = std::size_t(modifier.has_value());
		const std::size_t intLength = s.length() -
			(remarkFormat ? 0 : unitLength) -
            intPos;
		static const int minDigits = 1, maxDigits = 2;
		if (intLength < minDigits || intLength > maxDigits) return error;
		const auto dist = strToUint(s, intPos, intLength);
		if (!dist.has_value()) return error;
		distance.dist = *dist * statuteMileFactor;
	} else {
		//Fraction value, e.g. 1/2SM, 11/2SM, 5/16SM, 11/16SM
        const std::size_t intPos = std::size_t(modifier.has_value());
		const std::size_t fracLength = s.length() -
			(remarkFormat ? 0: unitLength) -
			intPos;
		const auto fraction = fractionStrToUint(s,
                                                intPos,
                                                fracLength);
		if (!fraction.has_value()) return error;
		auto integer = 0u;
		auto numerator = std::get<0>(*fraction);
		auto denominator = std::get<1>(*fraction);
		if (!numerator || !denominator) return error;
		if (numerator >= denominator) { //e.g. 11/2SM = 1 1/2SM
			static const auto decimalRadix = 10u;
			integer = numerator / decimalRadix;
			numerator = numerator % decimalRadix;
		}
		if (!numerator) return error;
		distance.dist = 
			integer * statuteMileFactor + 
			numerator * statuteMileFactor / denominator;
	}
	return distance;
}